

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

BorderStyle parseStyleValue(Value *v)

{
  int iVar1;
  BorderStyle BVar2;
  
  BVar2 = BorderStyle_Unknown;
  if (v->type == KnownIdentifier) {
    BVar2 = BorderStyle_Unknown;
    iVar1 = QVariant::toInt((bool *)&v->variant);
    if (iVar1 - 0x18U < 0x10) {
      BVar2 = *(BorderStyle *)(&DAT_00613570 + (ulong)(iVar1 - 0x18U) * 4);
    }
  }
  return BVar2;
}

Assistant:

static BorderStyle parseStyleValue(const QCss::Value &v)
{
    if (v.type == Value::KnownIdentifier) {
        switch (v.variant.toInt()) {
        case Value_None:
            return BorderStyle_None;
        case Value_Dotted:
            return BorderStyle_Dotted;
        case Value_Dashed:
            return BorderStyle_Dashed;
        case Value_Solid:
            return BorderStyle_Solid;
        case Value_Double:
            return BorderStyle_Double;
        case Value_DotDash:
            return BorderStyle_DotDash;
        case Value_DotDotDash:
            return BorderStyle_DotDotDash;
        case Value_Groove:
            return BorderStyle_Groove;
        case Value_Ridge:
            return BorderStyle_Ridge;
        case Value_Inset:
            return BorderStyle_Inset;
        case Value_Outset:
            return BorderStyle_Outset;
        case Value_Native:
            return BorderStyle_Native;
        default:
            break;
        }
    }

    return BorderStyle_Unknown;
}